

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

void yy_2_statementlist(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIP_node_push_child(G->val[-2],G->val[-1]);
  G->ss = G->val[-2];
  return;
}

Assistant:

YY_ACTION(void) yy_2_statementlist(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define s2 G->val[-1]
#define s1 G->val[-2]
  yyprintf((stderr, "do yy_2_statementlist"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
                PVIP_node_push_child(s1, s2);\n\
                yy=s1;\n\
            }\n"));
  
                PVIP_node_push_child(s1, s2);
                yy=s1;
            ;
#undef s2
#undef s1
}